

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmConditional(LlvmCompilationContext *ctx,ExprConditional *node)

{
  ExpressionContext *pEVar1;
  LLVMValueRef pLVar2;
  long lVar3;
  TypeBase *pTVar4;
  TypeBase *pTVar5;
  
  CompileLlvm(ctx,node->condition);
  pTVar5 = node->condition->type;
  pEVar1 = ctx->ctx;
  lVar3 = 0x89d8;
  if (((pEVar1->typeBool == pTVar5) || (pEVar1->typeChar == pTVar5)) ||
     (pEVar1->typeShort == pTVar5)) {
LAB_001930bb:
    pTVar5 = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar3 + -0x30);
  }
  else if (pEVar1->typeFloat == pTVar5) {
    lVar3 = 0x89f0;
    goto LAB_001930bb;
  }
  CompileLlvmType(ctx,pTVar5);
  CompileLlvmType(ctx,(node->super_ExprBase).type);
  pLVar2 = CompileLlvm(ctx,node->trueBlock);
  pTVar5 = node->trueBlock->type;
  pEVar1 = ctx->ctx;
  lVar3 = 0x89d8;
  if (((pEVar1->typeBool == pTVar5) || (pEVar1->typeChar == pTVar5)) ||
     (pEVar1->typeShort == pTVar5)) {
LAB_0019311b:
    pTVar4 = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar3 + -0x30);
  }
  else {
    pTVar4 = pTVar5;
    if (pEVar1->typeFloat == pTVar5) {
      lVar3 = 0x89f0;
      goto LAB_0019311b;
    }
  }
  ConvertToDataType(ctx,pLVar2,pTVar4,pTVar5);
  pLVar2 = CompileLlvm(ctx,node->falseBlock);
  pTVar5 = node->falseBlock->type;
  pEVar1 = ctx->ctx;
  lVar3 = 0x89d8;
  if (((pEVar1->typeBool != pTVar5) && (pEVar1->typeChar != pTVar5)) &&
     (pEVar1->typeShort != pTVar5)) {
    pTVar4 = pTVar5;
    if (pEVar1->typeFloat != pTVar5) goto LAB_00193176;
    lVar3 = 0x89f0;
  }
  pTVar4 = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar3 + -0x30);
LAB_00193176:
  ConvertToDataType(ctx,pLVar2,pTVar4,pTVar5);
  pLVar2 = ConvertToStackType(ctx,(LLVMValueRef)&placeholderValue,(node->super_ExprBase).type);
  pLVar2 = CheckType(ctx,&node->super_ExprBase,pLVar2);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileLlvmConditional(LlvmCompilationContext &ctx, ExprConditional *node)
{
	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBasicBlockRef trueBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "cond_true");
	LLVMBasicBlockRef falseBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "cond_false");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "cond_exit");

	LLVMValueRef result = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, node->type), "cond");

	LLVMBuildCondBr(ctx.builder, condition, trueBlock, falseBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, trueBlock);

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, CompileLlvm(ctx, node->trueBlock), GetStackType(ctx, node->trueBlock->type), node->trueBlock->type), result);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, falseBlock);

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, CompileLlvm(ctx, node->falseBlock), GetStackType(ctx, node->falseBlock->type), node->falseBlock->type), result);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	return CheckType(ctx, node, ConvertToStackType(ctx, LLVMBuildLoad(ctx.builder, result, ""), node->type));
}